

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalCommonGenerator.cxx
# Opt level: O1

string * __thiscall
cmGlobalCommonGenerator::GetEditCacheCommand_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalCommonGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  cmake *this_00;
  size_type sVar4;
  int iVar5;
  string *psVar6;
  cmValue cVar7;
  string editCacheCommand;
  string local_90;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  cmGlobalGenerator::GetExtraGeneratorName_abi_cxx11_(&local_70,&this->super_cmGlobalGenerator);
  sVar4 = local_70._M_string_length;
  paVar1 = &local_70.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (sVar4 != 0) {
    psVar6 = cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + psVar6->_M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (this->super_cmGlobalGenerator).CMakeInstance;
  pcVar3 = (this_00->CMakeEditCommand)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar3,pcVar3 + (this_00->CMakeEditCommand)._M_string_length);
  paVar2 = &local_90.field_2;
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_EDIT_COMMAND","");
  cVar7 = cmake::GetCacheDefinition(this_00,&local_90);
  sVar4 = local_70._M_string_length;
  if (cVar7.Value == (string *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (sVar4 == 0) goto LAB_0063cd25;
  }
  iVar5 = (*(this->super_cmGlobalGenerator)._vptr_cmGlobalGenerator[0x44])(this);
  if (((byte)iVar5 & local_70._M_string_length == 0) == 1) {
    cmSystemTools::GetCMakeCursesCommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  if (local_70._M_string_length == 0) {
    cmSystemTools::GetCMakeGUICommand_abi_cxx11_();
    std::__cxx11::string::_M_assign((string *)&local_70);
  }
  if (local_70._M_string_length != 0) {
    local_90._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_EDIT_COMMAND","");
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Path to cache edit program executable.","");
    cmake::AddCacheEntry(this_00,&local_90,&local_70,(string *)local_50,4);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
LAB_0063cd25:
  local_90._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"CMAKE_EDIT_COMMAND","");
  cVar7 = cmake::GetCacheDefinition(this_00,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (cVar7.Value == (string *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    pcVar3 = ((cVar7.Value)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar3,pcVar3 + (cVar7.Value)->_M_string_length);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalCommonGenerator::GetEditCacheCommand() const
{
  // If generating for an extra IDE, the edit_cache target cannot
  // launch a terminal-interactive tool, so always use cmake-gui.
  if (!this->GetExtraGeneratorName().empty()) {
    return cmSystemTools::GetCMakeGUICommand();
  }

  // Use an internal cache entry to track the latest dialog used
  // to edit the cache, and use that for the edit_cache target.
  cmake* cm = this->GetCMakeInstance();
  std::string editCacheCommand = cm->GetCMakeEditCommand();
  if (!cm->GetCacheDefinition("CMAKE_EDIT_COMMAND") ||
      !editCacheCommand.empty()) {
    if (this->SupportsDirectConsole() && editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeCursesCommand();
    }
    if (editCacheCommand.empty()) {
      editCacheCommand = cmSystemTools::GetCMakeGUICommand();
    }
    if (!editCacheCommand.empty()) {
      cm->AddCacheEntry("CMAKE_EDIT_COMMAND", editCacheCommand,
                        "Path to cache edit program executable.",
                        cmStateEnums::INTERNAL);
    }
  }
  cmValue edit_cmd = cm->GetCacheDefinition("CMAKE_EDIT_COMMAND");
  return edit_cmd ? *edit_cmd : std::string();
}